

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharItem.cpp
# Opt level: O0

bool __thiscall Hpipe::CharItem::apply_rec(CharItem *this,function<bool_(Hpipe::CharItem_*)> *f)

{
  CharItem *this_00;
  bool bVar1;
  function<bool_(Hpipe::CharItem_*)> local_68;
  reference local_48;
  CharEdge *t;
  iterator __end1;
  iterator __begin1;
  Vec<Hpipe::CharEdge> *__range1;
  bool res;
  function<bool_(Hpipe::CharItem_*)> *f_local;
  CharItem *this_local;
  
  if (this->op_id == cur_op_id) {
    this_local._7_1_ = true;
  }
  else {
    this->op_id = cur_op_id;
    bVar1 = std::function<bool_(Hpipe::CharItem_*)>::operator()(f,this);
    if (bVar1) {
      this_local._7_1_ = true;
      __end1 = std::vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>::begin
                         (&(this->edges).
                           super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>);
      t = (CharEdge *)
          std::vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>::end
                    (&(this->edges).super_vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>)
      ;
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<Hpipe::CharEdge_*,_std::vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>_>
                                         *)&t), bVar1) {
        local_48 = __gnu_cxx::
                   __normal_iterator<Hpipe::CharEdge_*,_std::vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>_>
                   ::operator*(&__end1);
        this_00 = local_48->item;
        std::function<bool_(Hpipe::CharItem_*)>::function(&local_68,f);
        bVar1 = apply_rec(this_00,&local_68);
        std::function<bool_(Hpipe::CharItem_*)>::~function(&local_68);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          this_local._7_1_ = false;
        }
        __gnu_cxx::
        __normal_iterator<Hpipe::CharEdge_*,_std::vector<Hpipe::CharEdge,_std::allocator<Hpipe::CharEdge>_>_>
        ::operator++(&__end1);
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CharItem::apply_rec( std::function<bool( CharItem * )> f ) {
    if ( op_id == CharItem::cur_op_id )
        return true;
    op_id = CharItem::cur_op_id;

    if ( not f( this ) )
        return false;

    bool res = true;
    for( CharEdge &t : edges )
        if ( not t.item->apply_rec( f ) )
            res = false;
    return res;
}